

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O2

void __thiscall PSBTInput::Unserialize<DataStream>(PSBTInput *this,DataStream *s)

{
  long lVar1;
  pointer pbVar2;
  size_type sVar3;
  pointer puVar4;
  pointer puVar5;
  bool bVar6;
  bool bVar7;
  uint64_t uVar8;
  size_type sVar9;
  size_type sVar10;
  pointer pbVar11;
  _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  *this_00;
  ulong uVar12;
  size_type sVar13;
  size_type sVar14;
  size_type sVar15;
  char *pcVar16;
  pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_RCX;
  uint *__args_1;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *v;
  pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *this_01;
  pointer pbVar17;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  pVar18;
  Span<const_unsigned_char> vch;
  Span<const_unsigned_char> vch_00;
  Span<const_unsigned_char> vch_01;
  Span<const_unsigned_char> vch_02;
  SpanReader s_key;
  int sighash;
  SpanReader skey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  XOnlyPubKey xonly;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  undefined1 auStack_e0 [24];
  pointer puStack_c8;
  pointer local_c0;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> leaf_hashes;
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  key_lookup;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &key_lookup._M_t._M_impl.super__Rb_tree_header._M_header;
  key_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  key_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  key_lookup._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar6 = false;
  key_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       key_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((long)(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start == s->m_read_pos) break;
    key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,&key);
    puVar5 = key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar4 = key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar6 = true;
      __args_1 = (uint *)in_RCX;
      goto LAB_002ef8ba;
    }
    skey.m_data.m_size =
         (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    skey.m_data.m_data =
         key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    uVar8 = ReadCompactSize<SpanReader>(&skey,true);
    __args_1 = &switchD_002eec47::switchdataD_00424adc;
    switch(uVar8) {
    case 0:
      pVar18 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Duplicate Key, input non-witness utxo already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Non-witness utxo key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "\x01";
      val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)this;
      UnserializeFromVector<DataStream,ParamsWrapper<TransactionSerParams,std::shared_ptr<CTransaction_const>>>
                (s,(ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *)
                   &val_bytes);
      break;
    case 1:
      pVar18 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Duplicate Key, input witness utxo already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Witness utxo key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      UnserializeFromVector<DataStream,CTxOut&>(s,&this->witness_utxo);
      break;
    case 2:
      if (((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start == 0x22) ||
         ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 0x42)) {
        CPubKey::
        Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((CPubKey *)&leaf_hashes,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 1),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish);
        bVar7 = CPubKey::IsFullyValid((CPubKey *)&leaf_hashes);
        if (bVar7) {
          CPubKey::GetID((CKeyID *)&val_bytes,(CPubKey *)&leaf_hashes);
          sVar14 = std::
                   map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                   ::count(&this->partial_sigs,(key_type *)&val_bytes);
          if (sVar14 == 0) {
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
            Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                      (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&xonly);
            CPubKey::GetID((CKeyID *)&sig,(CPubKey *)&leaf_hashes);
            memcpy(&val_bytes,(CPubKey *)&leaf_hashes,0x41);
            auStack_e0[0x10] = xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0];
            auStack_e0[0x11] = xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[1];
            auStack_e0[0x12] = xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[2];
            auStack_e0[0x13] = xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[3];
            auStack_e0[0x14] = xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[4];
            auStack_e0[0x15] = xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[5];
            auStack_e0[0x16] = xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[6];
            auStack_e0[0x17] = xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[7];
            puStack_c8 = (pointer)xonly.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_;
            local_c0 = (pointer)xonly.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_;
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
            xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
            std::
            _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
            ::
            _M_emplace_unique<CKeyID,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_bool>
                        *)&this->partial_sigs,
                       (_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                        *)&sig,(CKeyID *)&val_bytes,
                       (pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
                       )__args_1);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                       (auStack_e0 + 0x10));
            this_01 = (pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                      &xonly;
            goto LAB_002ef8b5;
          }
          pcVar16 = (char *)__cxa_allocate_exception(0x20);
          val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
          val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(val_bytes.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,1);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar16,(error_code *)
                             "Duplicate Key, input partial signature for pubkey already provided");
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
        }
        else {
          pcVar16 = (char *)__cxa_allocate_exception(0x20);
          val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
          val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(val_bytes.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,1);
          std::ios_base::failure[abi:cxx11]::failure(pcVar16,(error_code *)"Invalid pubkey");
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
        }
      }
      else {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)
                           "Size of key was not the expected size for the type partial signature pubkey"
                  );
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      goto LAB_002f1123;
    case 3:
      pVar18 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Duplicate Key, input sighash type already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Sighash type key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      UnserializeFromVector<DataStream,int&>(s,&sighash);
      (this->sighash_type).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int> =
           (_Optional_payload_base<int>)((ulong)(uint)sighash | 0x100000000);
      break;
    case 4:
      pVar18 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Duplicate Key, input redeemScript already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      else {
        v = &(this->redeem_script).super_CScriptBase;
        if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start == 1) goto LAB_002ef6d9;
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Input redeemScript key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      goto LAB_002f1123;
    case 5:
      pVar18 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Duplicate Key, input witnessScript already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      else {
        v = &(this->witness_script).super_CScriptBase;
        if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start == 1) goto LAB_002ef6d9;
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Input witnessScript key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      goto LAB_002f1123;
    case 6:
      DeserializeHDKeypaths<DataStream>(s,&key,&this->hd_keypaths);
      break;
    case 7:
      pVar18 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Duplicate Key, input final scriptSig already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      v = &(this->final_script_sig).super_CScriptBase;
      if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Final scriptSig key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
LAB_002ef6d9:
      Unserialize<DataStream,28u,unsigned_char>(s,v);
      break;
    case 8:
      pVar18 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Duplicate Key, input final scriptWitness already provided"
                  );
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Final scriptWitness key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      UnserializeFromVector<DataStream,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>&>
                (s,&(this->final_script_witness).stack);
      break;
    case 9:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
switchD_002eec47_caseD_9:
      sVar10 = std::
               map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::count(&this->unknown,&key);
      if (sVar10 == 0) {
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,&val_bytes);
        std::
        _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        _M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                    *)&this->unknown,
                   (_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)&key,&val_bytes,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__args_1);
        this_01 = (pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                  &val_bytes;
        goto LAB_002ef8b5;
      }
      pcVar16 = (char *)__cxa_allocate_exception(0x20);
      val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
      val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(val_bytes.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,1);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar16,(error_code *)"Duplicate Key, key for unknown value already provided");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_002f1123;
    case 10:
      if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 0x15) {
        __args_1 = (uint *)&leaf_hashes;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&val_bytes,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 1),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,(allocator_type *)__args_1);
        vch_02.m_size =
             (long)val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        vch_02.m_data =
             val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        base_blob<160U>::base_blob((base_blob<160U> *)&xonly,vch_02);
        sVar13 = std::
                 map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::count(&this->ripemd160_preimages,(key_type *)&xonly);
        if (sVar13 == 0) {
          leaf_hashes._M_t._M_impl._0_8_ = 0;
          leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                    (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&leaf_hashes);
          std::
          _Rb_tree<uint160,std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint160>,std::allocator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
          ::_M_emplace_unique<uint160&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((pair<std::_Rb_tree_iterator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                      *)&this->ripemd160_preimages,
                     (_Rb_tree<uint160,std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint160>,std::allocator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                      *)&xonly,(uint160 *)&leaf_hashes,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__args_1);
          goto LAB_002ef8a5;
        }
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = std::iostream_category();
        leaf_hashes._M_t._M_impl._0_4_ = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Duplicate Key, input ripemd160 preimage already provided")
        ;
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      else {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)
                           "Size of key was not the expected size for the type ripemd160 preimage");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      goto LAB_002f1123;
    case 0xb:
      if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 0x21) {
        __args_1 = (uint *)&val_bytes;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&leaf_hashes,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 1),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,(allocator_type *)&val_bytes);
        vch_00.m_size =
             leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
             leaf_hashes._M_t._M_impl._0_8_;
        vch_00.m_data = (uchar *)leaf_hashes._M_t._M_impl._0_8_;
        base_blob<256U>::base_blob((base_blob<256U> *)&val_bytes,vch_00);
        sVar15 = std::
                 map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::count(&this->sha256_preimages,(key_type *)&val_bytes);
        if (sVar15 == 0) {
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
          Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                    (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&xonly);
          std::
          _Rb_tree<uint256,std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
          ::_M_emplace_unique<uint256&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                      *)&this->sha256_preimages,
                     (_Rb_tree<uint256,std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                      *)&val_bytes,&xonly.m_keydata,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__args_1);
          goto LAB_002ef7e1;
        }
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ = std::iostream_category();
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Duplicate Key, input sha256 preimage already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      else {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)
                           "Size of key was not the expected size for the type sha256 preimage");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      goto LAB_002f1123;
    case 0xc:
      if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 0x15) {
        __args_1 = (uint *)&leaf_hashes;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&val_bytes,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 1),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,(allocator_type *)__args_1);
        vch.m_size = (long)val_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)val_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
        vch.m_data = val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        base_blob<160U>::base_blob((base_blob<160U> *)&xonly,vch);
        sVar13 = std::
                 map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::count(&this->hash160_preimages,(key_type *)&xonly);
        if (sVar13 == 0) {
          leaf_hashes._M_t._M_impl._0_8_ = 0;
          leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                    (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&leaf_hashes);
          std::
          _Rb_tree<uint160,std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint160>,std::allocator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
          ::_M_emplace_unique<uint160&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((pair<std::_Rb_tree_iterator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                      *)&this->hash160_preimages,
                     (_Rb_tree<uint160,std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint160>,std::allocator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                      *)&xonly,(uint160 *)&leaf_hashes,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__args_1);
LAB_002ef8a5:
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&leaf_hashes);
          this_01 = (pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                    &val_bytes;
          goto LAB_002ef8b5;
        }
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = std::iostream_category();
        leaf_hashes._M_t._M_impl._0_4_ = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Duplicate Key, input hash160 preimage already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      else {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)
                           "Size of key was not the expected size for the type hash160 preimage");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      goto LAB_002f1123;
    case 0xd:
      if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 0x21) {
        __args_1 = (uint *)&val_bytes;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&leaf_hashes,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 1),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,(allocator_type *)&val_bytes);
        vch_01.m_size =
             leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
             leaf_hashes._M_t._M_impl._0_8_;
        vch_01.m_data = (uchar *)leaf_hashes._M_t._M_impl._0_8_;
        base_blob<256U>::base_blob((base_blob<256U> *)&val_bytes,vch_01);
        sVar15 = std::
                 map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::count(&this->hash256_preimages,(key_type *)&val_bytes);
        if (sVar15 == 0) {
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
          xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
          Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                    (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&xonly);
          std::
          _Rb_tree<uint256,std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
          ::_M_emplace_unique<uint256&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                      *)&this->hash256_preimages,
                     (_Rb_tree<uint256,std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                      *)&val_bytes,&xonly.m_keydata,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__args_1);
LAB_002ef7e1:
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&xonly);
          this_01 = (pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                    &leaf_hashes;
          goto LAB_002ef8b5;
        }
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ = std::iostream_category();
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Duplicate Key, input hash256 preimage already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      else {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)
                           "Size of key was not the expected size for the type hash256 preimage");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      goto LAB_002f1123;
    case 0x13:
      pVar18 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)
                           "Duplicate Key, input Taproot key signature already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)
                           "Input Taproot key signature key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,&this->m_tap_key_sig);
      uVar12 = (long)(this->m_tap_key_sig).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_tap_key_sig).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar12 < 0x40) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Input Taproot key path signature is shorter than 64 bytes"
                  );
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      if (0x41 < uVar12) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Input Taproot key path signature is longer than 65 bytes")
        ;
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      break;
    case 0x14:
      pVar18 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)
                           "Duplicate Key, input Taproot script signature already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      __args_1 = (uint *)(key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish +
                         -(long)key.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      if ((pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)__args_1 !=
          (pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x41) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Input Taproot script signature key is not 65 bytes");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      s_key.m_data.m_data =
           key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
      s_key.m_data.m_size = 0x40;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      leaf_hashes._M_t._M_impl._0_8_ = 0;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      base_blob<256U>::Unserialize<SpanReader>((base_blob<256U> *)&leaf_hashes,&s_key);
      base_blob<256U>::Unserialize<SpanReader>((base_blob<256U> *)&xonly,&s_key);
      sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,&sig);
      if ((ulong)((long)sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_start) < 0x40) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)
                           "Input Taproot script path signature is shorter than 64 bytes");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      if (0x41 < (ulong)((long)sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start)) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)
                           "Input Taproot script path signature is longer than 65 bytes");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)leaf_hashes._M_t._M_impl._0_8_;
      val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)xonly.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_;
      auStack_e0[0] = xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18];
      auStack_e0[1] = xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19];
      auStack_e0[2] = xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a];
      auStack_e0[3] = xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b];
      auStack_e0[4] = xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c];
      auStack_e0[5] = xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d];
      auStack_e0[6] = xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e];
      auStack_e0[7] = xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f];
      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)xonly.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_;
      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)xonly.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_;
      std::
      _Rb_tree<std::pair<XOnlyPubKey,uint256>,std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::pair<XOnlyPubKey,uint256>>,std::allocator<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
      ::
      _M_emplace_unique<std::pair<XOnlyPubKey,uint256>,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                ((pair<std::_Rb_tree_iterator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                  *)&this->m_tap_script_sigs,
                 (_Rb_tree<std::pair<XOnlyPubKey,uint256>,std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::pair<XOnlyPubKey,uint256>>,std::allocator<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                  *)&val_bytes,(pair<XOnlyPubKey,_uint256> *)&sig,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__args_1);
      this_01 = (pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)&sig;
LAB_002ef8b5:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this_01);
      break;
    case 0x15:
      pVar18 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Duplicate Key, input Taproot leaf script already provided"
                  );
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      if ((ulong)((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_start) < 0x22) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Taproot leaf script key is not at least 34 bytes");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      if (((int)((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start) + 0x1eU & 0x1f) != 0) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)
                           "Input Taproot leaf script key\'s control block size is not valid");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      leaf_hashes._M_t._M_impl._0_8_ = 0;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&leaf_hashes);
      if (leaf_hashes._M_t._M_impl._0_8_ ==
          leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Input Taproot leaf script must be at least 1 byte");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + -1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&val_bytes,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&leaf_hashes);
      this_00 = (_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                 *)std::
                   map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                   ::operator[](&this->m_tap_scripts,(key_type *)&val_bytes);
      __args_1 = (uint *)&sig;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&xonly,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start + 1),
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,(allocator_type *)&sig);
      std::
      _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::_M_insert_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&xonly);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&xonly);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&leaf_hashes);
      break;
    case 0x16:
      pVar18 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)
                           "Duplicate Key, input Taproot BIP32 keypath already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      __args_1 = (uint *)(key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish +
                         -(long)key.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      if ((pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)__args_1 !=
          (pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x21) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Input Taproot BIP32 keypath key is not at 33 bytes");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      s_key.m_data.m_data =
           key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
      s_key.m_data.m_size = 0x20;
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      base_blob<256U>::Unserialize<SpanReader>((base_blob<256U> *)&xonly,&s_key);
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pbVar11 = (pointer)ReadCompactSize<DataStream>(s,true);
      pbVar2 = (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
               .super__Vector_impl_data._M_start;
      pbVar17 = (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      sVar3 = s->m_read_pos;
      Unserialize<DataStream,uint256,std::less<uint256>,std::allocator<uint256>>(s,&leaf_hashes);
      pbVar17 = pbVar17 + (long)((s->vch).
                                 super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                                (s->m_read_pos -
                                (long)((s->vch).
                                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                       ._M_impl.super__Vector_impl_data._M_finish +
                                      (long)(pbVar2 + sVar3))));
      if (pbVar11 < pbVar17) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Input Taproot BIP32 keypath has an invalid length");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      DeserializeKeyOrigin<DataStream>((KeyOriginInfo *)&sig,s,(long)pbVar11 - (long)pbVar17);
      std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>::
      pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>_&,_KeyOriginInfo,_true>
                ((pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                  *)&val_bytes,&leaf_hashes,(KeyOriginInfo *)&sig);
      std::
      _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
      ::
      _M_emplace_unique<XOnlyPubKey&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>
                ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
                  *)&this->m_tap_bip32_paths,&xonly,
                 (pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                  *)&val_bytes);
      std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>::
      ~pair((pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo> *)
            &val_bytes);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&leaf_hashes._M_t);
      break;
    case 0x17:
      pVar18 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)
                           "Duplicate Key, input Taproot internal key already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Input Taproot internal key key is more than one byte type"
                  );
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      UnserializeFromVector<DataStream,XOnlyPubKey&>(s,&this->m_tap_internal_key);
      break;
    case 0x18:
      pVar18 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Duplicate Key, input Taproot merkle root already provided"
                  );
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
        val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(val_bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Input Taproot merkle root key is more than one byte type")
        ;
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      UnserializeFromVector<DataStream,uint256&>(s,&this->m_tap_merkle_root);
      break;
    default:
      __args_1 = (uint *)in_RCX;
      if (uVar8 != 0xfc) goto switchD_002eec47_caseD_9;
      auStack_e0._0_8_ = (pointer)0x0;
      auStack_e0._8_8_ = (pointer)0x0;
      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      auStack_e0._16_8_ = (pointer)0x0;
      Unserialize<SpanReader,unsigned_char,std::allocator<unsigned_char>>
                (&skey,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
      val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ReadCompactSize<SpanReader>(&skey,true);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_f8,&key);
      sVar9 = std::
              set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>::
              count(&this->m_proprietary,(key_type *)&val_bytes);
      if (sVar9 != 0) {
        pcVar16 = (char *)__cxa_allocate_exception(0x20);
        leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = std::iostream_category();
        leaf_hashes._M_t._M_impl._0_4_ = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar16,(error_code *)"Duplicate Key, proprietary key already found");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_002f1123;
      }
      Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_e0);
      std::
      _Rb_tree<PSBTProprietary,PSBTProprietary,std::_Identity<PSBTProprietary>,std::less<PSBTProprietary>,std::allocator<PSBTProprietary>>
      ::_M_insert_unique<PSBTProprietary_const&>
                ((_Rb_tree<PSBTProprietary,PSBTProprietary,std::_Identity<PSBTProprietary>,std::less<PSBTProprietary>,std::allocator<PSBTProprietary>>
                  *)&this->m_proprietary,(PSBTProprietary *)&val_bytes);
      PSBTProprietary::~PSBTProprietary((PSBTProprietary *)&val_bytes);
      __args_1 = (uint *)in_RCX;
    }
LAB_002ef8ba:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    in_RCX = (pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)__args_1;
  } while (puVar4 != puVar5);
  if (bVar6) {
    std::
    _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~_Rb_tree(&key_lookup._M_t);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    pcVar16 = (char *)__cxa_allocate_exception(0x20);
    val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
    val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(val_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,1);
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar16,(error_code *)"Separator is missing at the end of an input map");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar16,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_002f1123:
  __stack_chk_fail();
}

Assistant:

inline void Unserialize(Stream& s) {
        // Used for duplicate key detection
        std::set<std::vector<unsigned char>> key_lookup;

        // Read loop
        bool found_sep = false;
        while(!s.empty()) {
            // Read
            std::vector<unsigned char> key;
            s >> key;

            // the key is empty if that was actually a separator byte
            // This is a special case for key lengths 0 as those are not allowed (except for separator)
            if (key.empty()) {
                found_sep = true;
                break;
            }

            // Type is compact size uint at beginning of key
            SpanReader skey{key};
            uint64_t type = ReadCompactSize(skey);

            // Do stuff based on type
            switch(type) {
                case PSBT_IN_NON_WITNESS_UTXO:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input non-witness utxo already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Non-witness utxo key is more than one byte type");
                    }
                    // Set the stream to unserialize with witness since this is always a valid network transaction
                    UnserializeFromVector(s, TX_WITH_WITNESS(non_witness_utxo));
                    break;
                }
                case PSBT_IN_WITNESS_UTXO:
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input witness utxo already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Witness utxo key is more than one byte type");
                    }
                    UnserializeFromVector(s, witness_utxo);
                    break;
                case PSBT_IN_PARTIAL_SIG:
                {
                    // Make sure that the key is the size of pubkey + 1
                    if (key.size() != CPubKey::SIZE + 1 && key.size() != CPubKey::COMPRESSED_SIZE + 1) {
                        throw std::ios_base::failure("Size of key was not the expected size for the type partial signature pubkey");
                    }
                    // Read in the pubkey from key
                    CPubKey pubkey(key.begin() + 1, key.end());
                    if (!pubkey.IsFullyValid()) {
                       throw std::ios_base::failure("Invalid pubkey");
                    }
                    if (partial_sigs.count(pubkey.GetID()) > 0) {
                        throw std::ios_base::failure("Duplicate Key, input partial signature for pubkey already provided");
                    }

                    // Read in the signature from value
                    std::vector<unsigned char> sig;
                    s >> sig;

                    // Add to list
                    partial_sigs.emplace(pubkey.GetID(), SigPair(pubkey, std::move(sig)));
                    break;
                }
                case PSBT_IN_SIGHASH:
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input sighash type already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Sighash type key is more than one byte type");
                    }
                    int sighash;
                    UnserializeFromVector(s, sighash);
                    sighash_type = sighash;
                    break;
                case PSBT_IN_REDEEMSCRIPT:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input redeemScript already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Input redeemScript key is more than one byte type");
                    }
                    s >> redeem_script;
                    break;
                }
                case PSBT_IN_WITNESSSCRIPT:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input witnessScript already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Input witnessScript key is more than one byte type");
                    }
                    s >> witness_script;
                    break;
                }
                case PSBT_IN_BIP32_DERIVATION:
                {
                    DeserializeHDKeypaths(s, key, hd_keypaths);
                    break;
                }
                case PSBT_IN_SCRIPTSIG:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input final scriptSig already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Final scriptSig key is more than one byte type");
                    }
                    s >> final_script_sig;
                    break;
                }
                case PSBT_IN_SCRIPTWITNESS:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input final scriptWitness already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Final scriptWitness key is more than one byte type");
                    }
                    UnserializeFromVector(s, final_script_witness.stack);
                    break;
                }
                case PSBT_IN_RIPEMD160:
                {
                    // Make sure that the key is the size of a ripemd160 hash + 1
                    if (key.size() != CRIPEMD160::OUTPUT_SIZE + 1) {
                        throw std::ios_base::failure("Size of key was not the expected size for the type ripemd160 preimage");
                    }
                    // Read in the hash from key
                    std::vector<unsigned char> hash_vec(key.begin() + 1, key.end());
                    uint160 hash(hash_vec);
                    if (ripemd160_preimages.count(hash) > 0) {
                        throw std::ios_base::failure("Duplicate Key, input ripemd160 preimage already provided");
                    }

                    // Read in the preimage from value
                    std::vector<unsigned char> preimage;
                    s >> preimage;

                    // Add to preimages list
                    ripemd160_preimages.emplace(hash, std::move(preimage));
                    break;
                }
                case PSBT_IN_SHA256:
                {
                    // Make sure that the key is the size of a sha256 hash + 1
                    if (key.size() != CSHA256::OUTPUT_SIZE + 1) {
                        throw std::ios_base::failure("Size of key was not the expected size for the type sha256 preimage");
                    }
                    // Read in the hash from key
                    std::vector<unsigned char> hash_vec(key.begin() + 1, key.end());
                    uint256 hash(hash_vec);
                    if (sha256_preimages.count(hash) > 0) {
                        throw std::ios_base::failure("Duplicate Key, input sha256 preimage already provided");
                    }

                    // Read in the preimage from value
                    std::vector<unsigned char> preimage;
                    s >> preimage;

                    // Add to preimages list
                    sha256_preimages.emplace(hash, std::move(preimage));
                    break;
                }
                case PSBT_IN_HASH160:
                {
                    // Make sure that the key is the size of a hash160 hash + 1
                    if (key.size() != CHash160::OUTPUT_SIZE + 1) {
                        throw std::ios_base::failure("Size of key was not the expected size for the type hash160 preimage");
                    }
                    // Read in the hash from key
                    std::vector<unsigned char> hash_vec(key.begin() + 1, key.end());
                    uint160 hash(hash_vec);
                    if (hash160_preimages.count(hash) > 0) {
                        throw std::ios_base::failure("Duplicate Key, input hash160 preimage already provided");
                    }

                    // Read in the preimage from value
                    std::vector<unsigned char> preimage;
                    s >> preimage;

                    // Add to preimages list
                    hash160_preimages.emplace(hash, std::move(preimage));
                    break;
                }
                case PSBT_IN_HASH256:
                {
                    // Make sure that the key is the size of a hash256 hash + 1
                    if (key.size() != CHash256::OUTPUT_SIZE + 1) {
                        throw std::ios_base::failure("Size of key was not the expected size for the type hash256 preimage");
                    }
                    // Read in the hash from key
                    std::vector<unsigned char> hash_vec(key.begin() + 1, key.end());
                    uint256 hash(hash_vec);
                    if (hash256_preimages.count(hash) > 0) {
                        throw std::ios_base::failure("Duplicate Key, input hash256 preimage already provided");
                    }

                    // Read in the preimage from value
                    std::vector<unsigned char> preimage;
                    s >> preimage;

                    // Add to preimages list
                    hash256_preimages.emplace(hash, std::move(preimage));
                    break;
                }
                case PSBT_IN_TAP_KEY_SIG:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input Taproot key signature already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Input Taproot key signature key is more than one byte type");
                    }
                    s >> m_tap_key_sig;
                    if (m_tap_key_sig.size() < 64) {
                        throw std::ios_base::failure("Input Taproot key path signature is shorter than 64 bytes");
                    } else if (m_tap_key_sig.size() > 65) {
                        throw std::ios_base::failure("Input Taproot key path signature is longer than 65 bytes");
                    }
                    break;
                }
                case PSBT_IN_TAP_SCRIPT_SIG:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input Taproot script signature already provided");
                    } else if (key.size() != 65) {
                        throw std::ios_base::failure("Input Taproot script signature key is not 65 bytes");
                    }
                    SpanReader s_key{Span{key}.subspan(1)};
                    XOnlyPubKey xonly;
                    uint256 hash;
                    s_key >> xonly;
                    s_key >> hash;
                    std::vector<unsigned char> sig;
                    s >> sig;
                    if (sig.size() < 64) {
                        throw std::ios_base::failure("Input Taproot script path signature is shorter than 64 bytes");
                    } else if (sig.size() > 65) {
                        throw std::ios_base::failure("Input Taproot script path signature is longer than 65 bytes");
                    }
                    m_tap_script_sigs.emplace(std::make_pair(xonly, hash), sig);
                    break;
                }
                case PSBT_IN_TAP_LEAF_SCRIPT:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input Taproot leaf script already provided");
                    } else if (key.size() < 34) {
                        throw std::ios_base::failure("Taproot leaf script key is not at least 34 bytes");
                    } else if ((key.size() - 2) % 32 != 0) {
                        throw std::ios_base::failure("Input Taproot leaf script key's control block size is not valid");
                    }
                    std::vector<unsigned char> script_v;
                    s >> script_v;
                    if (script_v.empty()) {
                        throw std::ios_base::failure("Input Taproot leaf script must be at least 1 byte");
                    }
                    uint8_t leaf_ver = script_v.back();
                    script_v.pop_back();
                    const auto leaf_script = std::make_pair(script_v, (int)leaf_ver);
                    m_tap_scripts[leaf_script].insert(std::vector<unsigned char>(key.begin() + 1, key.end()));
                    break;
                }
                case PSBT_IN_TAP_BIP32_DERIVATION:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input Taproot BIP32 keypath already provided");
                    } else if (key.size() != 33) {
                        throw std::ios_base::failure("Input Taproot BIP32 keypath key is not at 33 bytes");
                    }
                    SpanReader s_key{Span{key}.subspan(1)};
                    XOnlyPubKey xonly;
                    s_key >> xonly;
                    std::set<uint256> leaf_hashes;
                    uint64_t value_len = ReadCompactSize(s);
                    size_t before_hashes = s.size();
                    s >> leaf_hashes;
                    size_t after_hashes = s.size();
                    size_t hashes_len = before_hashes - after_hashes;
                    if (hashes_len > value_len) {
                        throw std::ios_base::failure("Input Taproot BIP32 keypath has an invalid length");
                    }
                    size_t origin_len = value_len - hashes_len;
                    m_tap_bip32_paths.emplace(xonly, std::make_pair(leaf_hashes, DeserializeKeyOrigin(s, origin_len)));
                    break;
                }
                case PSBT_IN_TAP_INTERNAL_KEY:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input Taproot internal key already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Input Taproot internal key key is more than one byte type");
                    }
                    UnserializeFromVector(s, m_tap_internal_key);
                    break;
                }
                case PSBT_IN_TAP_MERKLE_ROOT:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input Taproot merkle root already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Input Taproot merkle root key is more than one byte type");
                    }
                    UnserializeFromVector(s, m_tap_merkle_root);
                    break;
                }
                case PSBT_IN_PROPRIETARY:
                {
                    PSBTProprietary this_prop;
                    skey >> this_prop.identifier;
                    this_prop.subtype = ReadCompactSize(skey);
                    this_prop.key = key;

                    if (m_proprietary.count(this_prop) > 0) {
                        throw std::ios_base::failure("Duplicate Key, proprietary key already found");
                    }
                    s >> this_prop.value;
                    m_proprietary.insert(this_prop);
                    break;
                }
                // Unknown stuff
                default:
                    if (unknown.count(key) > 0) {
                        throw std::ios_base::failure("Duplicate Key, key for unknown value already provided");
                    }
                    // Read in the value
                    std::vector<unsigned char> val_bytes;
                    s >> val_bytes;
                    unknown.emplace(std::move(key), std::move(val_bytes));
                    break;
            }
        }

        if (!found_sep) {
            throw std::ios_base::failure("Separator is missing at the end of an input map");
        }
    }